

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffikey(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  __int32_t **pp_Var7;
  FITSfile *pFVar8;
  ulong uVar9;
  char *buffer;
  uint uVar10;
  ulong uVar11;
  char *buffer_00;
  long local_f0;
  char buff2 [81];
  char buff1 [81];
  
  if (0 < *status) {
    return *status;
  }
  pFVar8 = fptr->Fptr;
  if (fptr->HDUposition != pFVar8->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar8 = fptr->Fptr;
  }
  lVar6 = pFVar8->headend;
  if (pFVar8->datastart - lVar6 == 0x50) {
    iVar3 = ffiblk(fptr,1,0,status);
    if (0 < iVar3) goto LAB_0018fcc6;
    pFVar8 = fptr->Fptr;
    lVar6 = pFVar8->headend;
  }
  uVar4 = (lVar6 - pFVar8->nextkey) / 0x50;
  strncpy(buff2,card,0x50);
  buff2[0x50] = '\0';
  sVar5 = strlen(buff2);
  uVar9 = 0;
  uVar11 = sVar5 & 0xffffffff;
  if ((int)sVar5 < 1) {
    uVar11 = uVar9;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    if ((byte)(buff2[uVar9] + 0x81U) < 0xa1) {
      buff2[uVar9] = ' ';
    }
  }
  for (lVar6 = (long)(int)sVar5; lVar6 < 0x50; lVar6 = lVar6 + 1) {
    buff2[lVar6] = ' ';
  }
  sVar5 = strcspn(buff2,"=");
  uVar10 = (uint)sVar5;
  if ((uint)sVar5 == 0x50) {
    uVar10 = 8;
  }
  iVar3 = fits_strncasecmp("COMMENT ",buff2,8);
  if (iVar3 == 0) {
LAB_0018fbcc:
    uVar10 = 8;
  }
  else {
    iVar3 = fits_strncasecmp("HISTORY ",buff2,8);
    if (iVar3 == 0) goto LAB_0018fbcc;
    iVar3 = fits_strncasecmp("        ",buff2,8);
    if (iVar3 == 0) goto LAB_0018fbcc;
    iVar3 = fits_strncasecmp("CONTINUE",buff2,8);
    if (iVar3 == 0) goto LAB_0018fbcc;
  }
  uVar9 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar9;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    pp_Var7 = __ctype_toupper_loc();
    buff2[uVar9] = (char)(*pp_Var7)[buff2[uVar9]];
  }
  fftkey(buff2,status);
  local_f0 = fptr->Fptr->nextkey;
  ffmbyt(fptr,local_f0,0,status);
  uVar11 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar11 = 0;
  }
  pcVar2 = buff2;
  buffer_00 = buff1;
  while (buffer = pcVar2, iVar3 = (int)uVar11, uVar11 = (ulong)(iVar3 - 1), iVar3 != 0) {
    ffgbyt(fptr,0x50,buffer_00,status);
    ffmbyt(fptr,local_f0,0,status);
    ffpbyt(fptr,0x50,buffer,status);
    local_f0 = local_f0 + 0x50;
    pcVar2 = buffer_00;
    buffer_00 = buffer;
  }
  ffpbyt(fptr,0x50,buffer,status);
  pFVar8 = fptr->Fptr;
  pLVar1 = &pFVar8->headend;
  *pLVar1 = *pLVar1 + 0x50;
  pLVar1 = &pFVar8->nextkey;
  *pLVar1 = *pLVar1 + 0x50;
LAB_0018fcc6:
  return *status;
}

Assistant:

int ffikey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  insert a keyword at the position of (fptr->Fptr)->nextkey
*/
{
    int ii, len, nshift, keylength;
    long nblocks;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[FLEN_CARD], buff2[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* only room for END card */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* add new 2880-byte block*/
            return(*status);  
    }

    /* no. keywords to shift */
    nshift= (int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); 

    strncpy(buff2, card, 80);     /* copy card to output buffer */
    buff2[80] = '\0';

    len = strlen(buff2);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (buff2[ii] < ' ' || buff2[ii] > 126) buff2[ii] = ' ';

    for (ii=len; ii < 80; ii++)   /* fill buffer with spaces if necessary */
        buff2[ii] = ' ';

    keylength = strcspn(buff2, "=");
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", buff2, 8) || !fits_strncasecmp( "HISTORY ", buff2, 8) ||
         !fits_strncasecmp( "        ", buff2, 8) || !fits_strncasecmp( "CONTINUE", buff2, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        buff2[ii] = toupper(buff2[ii]);

    fftkey(buff2, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(buff2, status);  */      /* test rest of keyword for legal chars   */

    inbuff = buff1;
    outbuff = buff2;

    bytepos = (fptr->Fptr)->nextkey;           /* pointer to next keyword in header */
    ffmbyt(fptr, bytepos, REPORT_EOF, status);

    for (ii = 0; ii < nshift; ii++) /* shift each keyword down one position */
    {
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status); /* move back */
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with other buffer */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos += 80;
    }

    ffpbyt(fptr, 80, outbuff, status);  /* write the final keyword */

    (fptr->Fptr)->headend += 80; /* increment the position of the END keyword */
    (fptr->Fptr)->nextkey += 80; /* increment the pointer to next keyword */

    return(*status);
}